

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall gl4cts::GPUShaderFP64Test2::prepareShaderStages(GPUShaderFP64Test2 *this)

{
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  *this_00;
  iterator iVar1;
  ulong in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (this->m_pDispatchCompute != (arbDispatchComputeFunc)0x0) {
    uStack_18 = in_RAX & 0xffffffff;
    iVar1._M_current =
         (this->m_shader_stages).
         super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_shader_stages).
        super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ::_M_realloc_insert<gl4cts::GPUShaderFP64Test2::shaderStage>
                (&this->m_shader_stages,iVar1,(shaderStage *)((long)&uStack_18 + 4));
    }
    else {
      *iVar1._M_current = COMPUTE_SHADER;
      (this->m_shader_stages).
      super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  this_00 = &this->m_shader_stages;
  uStack_18 = CONCAT44(1,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_shader_stages).
       super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_shader_stages).
      super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test2::shaderStage>
              (this_00,iVar1,(shaderStage *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FRAGMENT_SHADER;
    (this->m_shader_stages).
    super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(2,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_shader_stages).
       super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_shader_stages).
      super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test2::shaderStage>
              (this_00,iVar1,(shaderStage *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = GEOMETRY_SHADER;
    (this->m_shader_stages).
    super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(3,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_shader_stages).
       super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_shader_stages).
      super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test2::shaderStage>
              (this_00,iVar1,(shaderStage *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = TESS_CTRL_SHADER;
    (this->m_shader_stages).
    super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(4,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_shader_stages).
       super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_shader_stages).
      super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test2::shaderStage>
              (this_00,iVar1,(shaderStage *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = TESS_EVAL_SHADER;
    (this->m_shader_stages).
    super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(5,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_shader_stages).
       super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_shader_stages).
      super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test2::shaderStage>
              (this_00,iVar1,(shaderStage *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = VERTEX_SHADER;
    (this->m_shader_stages).
    super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareShaderStages()
{
	/* m_pDispatchCompute is initialized only if compute_shader are supproted and context is at least 4.2 */
	if (0 != m_pDispatchCompute)
	{
		m_shader_stages.push_back(COMPUTE_SHADER);
	}

	m_shader_stages.push_back(FRAGMENT_SHADER);
	m_shader_stages.push_back(GEOMETRY_SHADER);
	m_shader_stages.push_back(TESS_CTRL_SHADER);
	m_shader_stages.push_back(TESS_EVAL_SHADER);
	m_shader_stages.push_back(VERTEX_SHADER);
}